

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

state * getstate(lemon *lemp)

{
  int iVar1;
  config *pcVar2;
  config *pcVar3;
  state *data;
  config *x;
  config *key;
  state *psVar4;
  
  Configlist_sortbasis();
  key = basis;
  basis = (config *)0x0;
  basisend = (config **)0x0;
  data = State_find(key);
  psVar4 = data;
  if (data == (state *)0x0) {
    Configlist_closure(lemp);
    Configlist_sort();
    pcVar3 = current;
    current = (config *)0x0;
    currentend = (config **)0x0;
    data = State_new();
    if (data == (state *)0x0) {
      memory_error();
    }
    data->bp = key;
    data->cfp = pcVar3;
    iVar1 = lemp->nstate;
    lemp->nstate = iVar1 + 1;
    data->statenum = iVar1;
    data->ap = (action *)0x0;
    State_insert(data,key);
    buildshifts(lemp,data);
  }
  else {
    while ((pcVar3 = current, key != (config *)0x0 && (pcVar2 = psVar4->bp, pcVar2 != (config *)0x0)
           )) {
      Plink_copy(&pcVar2->bplp,key->bplp);
      Plink_delete(key->fplp);
      key->fplp = (plink *)0x0;
      key->bplp = (plink *)0x0;
      key = key->bp;
      psVar4 = (state *)&pcVar2->bp;
    }
    current = (config *)0x0;
    currentend = (config **)0x0;
    Configlist_eat(pcVar3);
  }
  return data;
}

Assistant:

state *getstate(struct lemon *lemp)
{
  struct config *cfp, *bp;
  struct state *stp;

  /* Extract the sorted basis of the new state.  The basis was constructed
  ** by prior calls to "Configlist_addbasis()". */
  Configlist_sortbasis();
  bp = Configlist_basis();

  /* Get a state with the same basis */
  stp = State_find(bp);
  if( stp ){
    /* A state with the same basis already exists!  Copy all the follow-set
    ** propagation links from the state under construction into the
    ** preexisting state, then return a pointer to the preexisting state */
    struct config *x, *y;
    for(x=bp, y=stp->bp; x && y; x=x->bp, y=y->bp){
      Plink_copy(&y->bplp,x->bplp);
      Plink_delete(x->fplp);
      x->fplp = x->bplp = 0;
    }
    cfp = Configlist_return();
    Configlist_eat(cfp);
  }else{
    /* This really is a new state.  Construct all the details */
    Configlist_closure(lemp);    /* Compute the configuration closure */
    Configlist_sort();           /* Sort the configuration closure */
    cfp = Configlist_return();   /* Get a pointer to the config list */
    stp = State_new();           /* A new state structure */
    MemoryCheck(stp);
    stp->bp = bp;                /* Remember the configuration basis */
    stp->cfp = cfp;              /* Remember the configuration closure */
    stp->statenum = lemp->nstate++; /* Every state gets a sequence number */
    stp->ap = 0;                 /* No actions, yet. */
    State_insert(stp,stp->bp);   /* Add to the state table */
    buildshifts(lemp,stp);       /* Recursively compute successor states */
  }
  return stp;
}